

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall
HighsSimplexAnalysis::operationRecordAfter
          (HighsSimplexAnalysis *this,HighsInt operation_type,HighsInt result_count)

{
  long lVar1;
  int in_EDX;
  int in_ESI;
  double in_RDI;
  double dVar2;
  double dVar3;
  double result_density;
  AnIterOpRec *AnIter;
  
  lVar1 = (long)in_RDI + 0xa48 + (long)in_ESI * 0xe8;
  dVar2 = ((double)in_EDX * 1.0) / (double)*(int *)(lVar1 + 0x10);
  if (dVar2 <= 0.1) {
    *(int *)(lVar1 + 0x1c) = *(int *)(lVar1 + 0x1c) + 1;
  }
  if (0.0 < dVar2) {
    dVar2 = log(dVar2);
    dVar3 = log(10.0);
    *(double *)(lVar1 + 0x20) = dVar2 / dVar3 + *(double *)(lVar1 + 0x20);
  }
  updateValueDistribution(in_RDI,(HighsValueDistribution *)CONCAT44(in_ESI,in_EDX));
  return;
}

Assistant:

void HighsSimplexAnalysis::operationRecordAfter(const HighsInt operation_type,
                                                const HighsInt result_count) {
  AnIterOpRec& AnIter = AnIterOp[operation_type];
  const double result_density = 1.0 * result_count / AnIter.AnIterOpRsDim;
  if (result_density <= kHyperResult) AnIter.AnIterOpNumHyperRs++;
  if (result_density > 0) {
    AnIter.AnIterOpSumLog10RsDensity += log(result_density) / log(10.0);
  } else {
    /*
    // TODO Investigate these zero norms
    double vectorNorm = 0;

    for (HighsInt index = 0; index < AnIter.AnIterOpRsDim; index++) {
      double vectorValue = vector.array[index];
      vectorNorm += vectorValue * vectorValue;
    }
    vectorNorm = sqrt(vectorNorm);
    printf("Strange: operation %s has result density = %g: ||vector|| = %g\n",
    AnIter.AnIterOpName.c_str(), result_density, vectorNorm);
    */
  }
  updateValueDistribution(result_density, AnIter.AnIterOp_density);
}